

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus.c
# Opt level: O2

int corpus_set_partition(uint32 part,uint32 parts)

{
  uint32 run_len;
  lineiter_t *plVar1;
  uint uVar2;
  int iVar3;
  
  if (ctl_fp == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/corpus.c"
            ,0x21c,"Control file has not been set\n");
    iVar3 = -1;
  }
  else {
    plVar1 = lineiter_start(ctl_fp);
    uVar2 = 0;
    for (; plVar1 != (lineiter_t *)0x0; plVar1 = lineiter_next(plVar1)) {
      uVar2 = uVar2 + 1;
    }
    iVar3 = 0;
    fseek((FILE *)ctl_fp,0,0);
    plVar1 = lineiter_start(ctl_fp);
    lineiter_free(plVar1);
    run_len = 0xffffffff;
    if (part != parts) {
      run_len = uVar2 / parts;
    }
    corpus_set_interval((part - 1) * (uVar2 / parts),run_len);
  }
  return iVar3;
}

Assistant:

int
corpus_set_partition(uint32 part,
		     uint32 parts)
{
    uint32 run_len;
    uint32 n_skip;
    int lineno = 0;
    lineiter_t* li;

    if (ctl_fp == NULL) {
	E_ERROR("Control file has not been set\n");

	return S3_ERROR;
    }

    for (li = lineiter_start(ctl_fp); li; li = lineiter_next(li)) {
	lineno++;
    }

    fseek(ctl_fp, 0L, SEEK_SET);
    
    li = lineiter_start(ctl_fp);
    lineiter_free(li);
    
    run_len = lineno / parts;

    n_skip = (part - 1) * run_len;

    if (part == parts)
	run_len = UNTIL_EOF;

    return corpus_set_interval(n_skip, run_len);
}